

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.c
# Opt level: O2

int thread_start(thread_handle *pt)

{
  pthread_t *__newthread;
  int iVar1;
  int iVar2;
  pthread_attr_t attr;
  pthread_attr_t pStack_58;
  
  __newthread = (pthread_t *)pt->priv;
  iVar1 = pthread_attr_init(&pStack_58);
  if ((iVar1 == 0) &&
     (((ulong)pt->stack_size == 0 ||
      (iVar1 = pthread_attr_setstacksize(&pStack_58,(ulong)pt->stack_size), iVar1 == 0)))) {
    thread_join(pt);
    mutex_lock((mutex_handle *)(__newthread + 1));
    iVar1 = pthread_create(__newthread,&pStack_58,(__start_routine *)pt->func_ptr,pt);
    *(bool *)(__newthread + 2) = iVar1 == 0;
    mutex_unlock((mutex_handle *)(__newthread + 1));
  }
  iVar2 = -iVar1;
  if (iVar1 < 1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int thread_start(struct thread_handle *pt)
{
	struct thread_priv *priv = pt->priv;
	pthread_attr_t attr;
	int ret;

	ret = pthread_attr_init(&attr);
	if (ret != 0)
		return ret > 0 ? -ret : ret;

	if (pt->stack_size > 0) {
		ret = pthread_attr_setstacksize(&attr, pt->stack_size);
		if (ret != 0)
			return ret > 0 ? -ret : ret;
	}

	thread_join(pt);

	mutex_lock(&priv->mutex);

	ret = pthread_create(&priv->thread, &attr, pt->func_ptr, pt);

	priv->dirty = !(ret);

	mutex_unlock(&priv->mutex);

	return ret > 0 ? -ret : ret;
}